

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildElementC2
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot instanceSlot,RegSlot value2Slot,
          RegSlot regSlot,PropertyIdIndexType propertyIdIndex)

{
  code *pcVar1;
  bool bVar2;
  PropertyId PVar3;
  JITTimeFunctionBody *pJVar4;
  SymOpnd *pSVar5;
  PropertySymOpnd *pPVar6;
  RegOpnd *pRVar7;
  RegOpnd *pRVar8;
  ProfiledInstr *pPVar9;
  JITTimeProfileInfo *pJVar10;
  FldInfo *pFVar11;
  ProfiledInstr *pPVar12;
  FldInfo *pFVar13;
  undefined4 *puVar14;
  SymOpnd *fieldSymOpnd;
  RegOpnd *value2Opnd;
  RegOpnd *regOpnd;
  PropertyId propertyId;
  Instr *instr;
  RegSlot regSlot_local;
  RegSlot value2Slot_local;
  RegSlot instanceSlot_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  instanceSlot_local._2_2_ = newOpcode;
  _offset_local = this;
  switch(newOpcode) {
  case ProfiledLdSuperFld:
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled((OpCode *)((long)&instanceSlot_local + 2));
  case LdSuperFld:
    pJVar4 = Func::GetJITFunctionBody(this->m_func);
    PVar3 = JITTimeFunctionBody::GetPropertyIdFromCacheId(pJVar4,propertyIdIndex);
    pSVar5 = BuildFieldOpnd(this,instanceSlot_local._2_2_,instanceSlot,PVar3,0xffffffff,
                            PropertyKindData,propertyIdIndex);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar5);
    if (bVar2) {
      pPVar6 = IR::Opnd::AsPropertySymOpnd(&pSVar5->super_Opnd);
      IR::PropertySymOpnd::TryDisableRuntimePolymorphicCache(pPVar6);
    }
    pRVar7 = BuildSrcOpnd(this,value2Slot,TyVar);
    pRVar8 = BuildDstOpnd(this,regSlot,TyVar,false,false);
    pPVar9 = IR::ProfiledInstr::New
                       (instanceSlot_local._2_2_,&pRVar8->super_Opnd,&pSVar5->super_Opnd,
                        &pRVar7->super_Opnd,this->m_func);
    pJVar10 = Func::GetReadOnlyProfileInfo(this->m_func);
    pFVar11 = JITTimeProfileInfo::GetFldInfo(pJVar10,propertyIdIndex);
    pPVar12 = IR::Instr::AsProfiledInstr(&pPVar9->super_Instr);
    pFVar13 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                        ((anon_union_8_4_88fdcd80 *)&(pPVar12->u).field_3);
    *pFVar13 = *pFVar11;
    AddInstr(this,&pPVar9->super_Instr,offset);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x139b,"((0))","Unknown ElementC2 opcode");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar14 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  case ProfiledStSuperFld:
  case ProfiledStSuperFldStrict:
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled((OpCode *)((long)&instanceSlot_local + 2));
  case StSuperFld:
  case StSuperFldStrict:
    pJVar4 = Func::GetJITFunctionBody(this->m_func);
    PVar3 = JITTimeFunctionBody::GetPropertyIdFromCacheId(pJVar4,propertyIdIndex);
    pSVar5 = BuildFieldOpnd(this,instanceSlot_local._2_2_,instanceSlot,PVar3,0xffffffff,
                            PropertyKindData,propertyIdIndex);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar5);
    if (bVar2) {
      pPVar6 = IR::Opnd::AsPropertySymOpnd(&pSVar5->super_Opnd);
      IR::PropertySymOpnd::TryDisableRuntimePolymorphicCache(pPVar6);
    }
    pRVar7 = BuildSrcOpnd(this,regSlot,TyVar);
    pRVar8 = BuildSrcOpnd(this,value2Slot,TyVar);
    pPVar9 = IR::ProfiledInstr::New
                       (instanceSlot_local._2_2_,&pSVar5->super_Opnd,&pRVar7->super_Opnd,
                        &pRVar8->super_Opnd,this->m_func);
    pJVar10 = Func::GetReadOnlyProfileInfo(this->m_func);
    pFVar11 = JITTimeProfileInfo::GetFldInfo(pJVar10,propertyIdIndex);
    pPVar12 = IR::Instr::AsProfiledInstr(&pPVar9->super_Instr);
    pFVar13 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::FldInfo
                        ((anon_union_8_4_88fdcd80 *)&(pPVar12->u).field_3);
    *pFVar13 = *pFVar11;
    AddInstr(this,&pPVar9->super_Instr,offset);
  }
  return;
}

Assistant:

void
IRBuilder::BuildElementC2(Js::OpCode newOpcode, uint32 offset, Js::RegSlot instanceSlot, Js::RegSlot value2Slot,
                                Js::RegSlot regSlot, Js::PropertyIdIndexType propertyIdIndex)
{
    IR::Instr *     instr = nullptr;

    Js::PropertyId  propertyId;
    IR::RegOpnd *   regOpnd;
    IR::RegOpnd *   value2Opnd;
    IR::SymOpnd * fieldSymOpnd;

    switch (newOpcode)
    {
    case Js::OpCode::ProfiledLdSuperFld:
        Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);
        // fall-through

    case Js::OpCode::LdSuperFld:
        {
            propertyId = m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(propertyIdIndex);
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instanceSlot, propertyId, (Js::PropertyIdIndexType) - 1, PropertyKindData, propertyIdIndex);
            if (fieldSymOpnd->IsPropertySymOpnd())
            {
                fieldSymOpnd->AsPropertySymOpnd()->TryDisableRuntimePolymorphicCache();
            }

            value2Opnd = this->BuildSrcOpnd(value2Slot);
            regOpnd = this->BuildDstOpnd(regSlot);

            instr = IR::ProfiledInstr::New(newOpcode, regOpnd, fieldSymOpnd, value2Opnd, m_func);
            instr->AsProfiledInstr()->u.FldInfo() = *(m_func->GetReadOnlyProfileInfo()->GetFldInfo(propertyIdIndex));
            this->AddInstr(instr, offset);
        }
        break;

    case Js::OpCode::ProfiledStSuperFld:
    case Js::OpCode::ProfiledStSuperFldStrict:
        Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);
        // fall-through

    case Js::OpCode::StSuperFld:
    case Js::OpCode::StSuperFldStrict:
    {
        propertyId = m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(propertyIdIndex);
        fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instanceSlot, propertyId, (Js::PropertyIdIndexType) - 1, PropertyKindData, propertyIdIndex);
        if (fieldSymOpnd->IsPropertySymOpnd())
        {
            fieldSymOpnd->AsPropertySymOpnd()->TryDisableRuntimePolymorphicCache();
        }

        regOpnd = this->BuildSrcOpnd(regSlot);
        value2Opnd = this->BuildSrcOpnd(value2Slot);

        instr = IR::ProfiledInstr::New(newOpcode, fieldSymOpnd, regOpnd, value2Opnd, m_func);
        instr->AsProfiledInstr()->u.FldInfo() = *(m_func->GetReadOnlyProfileInfo()->GetFldInfo(propertyIdIndex));
        this->AddInstr(instr, offset);
        break;
    }

    default:
        AssertMsg(UNREACHED, "Unknown ElementC2 opcode");
        Fatal();
    }
}